

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_HasProperty(JSContext *ctx,JSValue obj,JSAtom prop)

{
  JSClassExoticMethods *pJVar1;
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  int iVar2;
  JSAtom in_ECX;
  int in_EDX;
  JSValueUnion in_RSI;
  JSContext *in_RDI;
  JSValue JVar3;
  JSClassExoticMethods *em;
  JSValue obj1;
  int ret;
  JSObject *p;
  JSAtom in_stack_000000b4;
  JSObject *in_stack_000000b8;
  JSPropertyDescriptor *in_stack_000000c0;
  JSContext *in_stack_000000c8;
  JSValueUnion in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  JSAtom in_stack_ffffffffffffff74;
  JSContext *ctx_00;
  JSValueUnion local_30;
  
  local_30 = in_RSI;
  if (in_EDX == -1) {
    do {
      if ((((*(byte *)((long)local_30.ptr + 5) >> 2 & 1) != 0) &&
          (pJVar1 = in_RDI->rt->class_array[*(ushort *)((long)local_30.ptr + 6)].exotic,
          pJVar1 != (JSClassExoticMethods *)0x0)) &&
         (pJVar1->has_property != (_func_int_JSContext_ptr_JSValue_JSAtom *)0x0)) {
        v_01.tag = -1;
        v_01.u.ptr = local_30.ptr;
        JVar3 = JS_DupValue(in_RDI,v_01);
        iVar2 = (*pJVar1->has_property)(in_RDI,JVar3,in_ECX);
        JVar3.tag._0_4_ = in_stack_ffffffffffffff70;
        JVar3.u = (JSValueUnion)in_stack_ffffffffffffff68;
        JVar3.tag._4_4_ = in_stack_ffffffffffffff74;
        JS_FreeValue((JSContext *)in_stack_ffffffffffffff60.ptr,JVar3);
        return iVar2;
      }
      v_00.tag = -1;
      v_00.u.ptr = local_30.ptr;
      JVar3 = JS_DupValue(in_RDI,v_00);
      in_stack_ffffffffffffff70 = JVar3.u._0_4_;
      in_stack_ffffffffffffff74 = JVar3.u._4_4_;
      ctx_00 = (JSContext *)JVar3.tag;
      iVar2 = JS_GetOwnPropertyInternal
                        (in_stack_000000c8,in_stack_000000c0,in_stack_000000b8,in_stack_000000b4);
      in_stack_ffffffffffffff68 = 0xffffffffffffffff;
      v.tag._0_4_ = in_stack_ffffffffffffff70;
      v.u.float64 = -NAN;
      v.tag._4_4_ = in_stack_ffffffffffffff74;
      in_stack_ffffffffffffff60 = local_30;
      JS_FreeValue((JSContext *)local_30.ptr,v);
      if (iVar2 != 0) {
        return iVar2;
      }
      if (((0x14 < *(ushort *)((long)local_30.ptr + 6)) &&
          (*(ushort *)((long)local_30.ptr + 6) < 0x1e)) &&
         (iVar2 = JS_AtomIsNumericIndex(ctx_00,in_stack_ffffffffffffff74), iVar2 != 0)) {
        if (-1 < iVar2) {
          return 0;
        }
        return -1;
      }
      local_30 = (JSValueUnion)((JSValueUnion *)(*(long *)((long)local_30.ptr + 0x18) + 0x38))->ptr;
    } while (local_30.ptr != (void *)0x0);
  }
  return 0;
}

Assistant:

int JS_HasProperty(JSContext *ctx, JSValueConst obj, JSAtom prop)
{
    JSObject *p;
    int ret;
    JSValue obj1;

    if (unlikely(JS_VALUE_GET_TAG(obj) != JS_TAG_OBJECT))
        return FALSE;
    p = JS_VALUE_GET_OBJ(obj);
    for(;;) {
        if (p->is_exotic) {
            const JSClassExoticMethods *em = ctx->rt->class_array[p->class_id].exotic;
            if (em && em->has_property) {
                /* has_property can free the prototype */
                obj1 = JS_DupValue(ctx, JS_MKPTR(JS_TAG_OBJECT, p));
                ret = em->has_property(ctx, obj1, prop);
                JS_FreeValue(ctx, obj1);
                return ret;
            }
        }
        /* JS_GetOwnPropertyInternal can free the prototype */
        JS_DupValue(ctx, JS_MKPTR(JS_TAG_OBJECT, p));
        ret = JS_GetOwnPropertyInternal(ctx, NULL, p, prop);
        JS_FreeValue(ctx, JS_MKPTR(JS_TAG_OBJECT, p));
        if (ret != 0)
            return ret;
        if (p->class_id >= JS_CLASS_UINT8C_ARRAY &&
            p->class_id <= JS_CLASS_FLOAT64_ARRAY) {
            ret = JS_AtomIsNumericIndex(ctx, prop);
            if (ret != 0) {
                if (ret < 0)
                    return -1;
                return FALSE;
            }
        }
        p = p->shape->proto;
        if (!p)
            break;
    }
    return FALSE;
}